

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

int pfx_table_remove(pfx_table *pfx_table,pfx_record *record)

{
  pthread_rwlock_t *__rwlock;
  lrtr_ip_addr *prefix;
  trie_node *root_node;
  node_data *data;
  int iVar1;
  trie_node *ptVar2;
  data_elem *pdVar3;
  long in_FS_OFFSET;
  uint index;
  _Bool found;
  uint lvl;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &pfx_table->lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  prefix = &record->prefix;
  root_node = (&pfx_table->ipv4)[(record->prefix).ver != LRTR_IPV4];
  lvl = 0;
  ptVar2 = trie_lookup_exact(root_node,prefix,record->min_len,&lvl,&found);
  if (found != false) {
    data = (node_data *)ptVar2->data;
    pdVar3 = pfx_table_find_elem(data,record,&index);
    if (pdVar3 != (data_elem *)0x0) {
      iVar1 = pfx_table_del_elem(data,index);
      if (iVar1 == -1) {
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        iVar1 = -1;
      }
      else {
        if (data->len == 0) {
          ptVar2 = trie_remove(ptVar2,prefix,record->min_len,lvl);
          if (ptVar2 == (trie_node *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                          ,0x12e,
                          "int pfx_table_remove(struct pfx_table *, const struct pfx_record *)");
          }
          if (ptVar2 == root_node) {
            (&pfx_table->ipv4)[prefix->ver != LRTR_IPV4] = (trie_node *)0x0;
          }
          if (*ptVar2->data != 0) {
            __assert_fail("((struct node_data *)node->data)->len == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                          ,0x136,
                          "int pfx_table_remove(struct pfx_table *, const struct pfx_record *)");
          }
          lrtr_free(ptVar2->data);
          lrtr_free(ptVar2);
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        if (pfx_table->update_fp == (pfx_update_fp)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = 0;
          (*pfx_table->update_fp)(pfx_table,*record,false);
        }
      }
      goto LAB_00107f9b;
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  iVar1 = -3;
LAB_00107f9b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

RTRLIB_EXPORT int pfx_table_remove(struct pfx_table *pfx_table, const struct pfx_record *record)
{
	pthread_rwlock_wrlock(&(pfx_table->lock));
	struct trie_node *root = pfx_table_get_root(pfx_table, record->prefix.ver);

	unsigned int lvl = 0; // tree depth were node was found
	bool found;
	struct trie_node *node = trie_lookup_exact(root, &(record->prefix), record->min_len, &lvl, &found);

	if (!found) {
		pthread_rwlock_unlock(&pfx_table->lock);
		return PFX_RECORD_NOT_FOUND;
	}

	unsigned int index;
	struct data_elem *elem = pfx_table_find_elem(node->data, record, &index);

	if (!elem) {
		pthread_rwlock_unlock(&pfx_table->lock);
		return PFX_RECORD_NOT_FOUND;
	}

	struct node_data *ndata = (struct node_data *)node->data;

	if (pfx_table_del_elem(ndata, index) == PFX_ERROR) {
		pthread_rwlock_unlock(&pfx_table->lock);
		return PFX_ERROR;
	}

	if (ndata->len == 0) {
		node = trie_remove(node, &(record->prefix), record->min_len, lvl);
		assert(node);

		if (node == root) {
			if (record->prefix.ver == LRTR_IPV4)
				pfx_table->ipv4 = NULL;
			else
				pfx_table->ipv6 = NULL;
		}
		assert(((struct node_data *)node->data)->len == 0);
		lrtr_free(node->data);
		lrtr_free(node);
	}
	pthread_rwlock_unlock(&pfx_table->lock);

	pfx_table_notify_clients(pfx_table, record, false);

	return PFX_SUCCESS;
}